

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<char>::emplace_back<char>(SmallVectorBase<char> *this,char *args)

{
  size_type sVar1;
  ulong uVar2;
  char *__src;
  size_t __n;
  pointer __dest;
  char *__src_00;
  long lVar3;
  ulong n;
  
  __src_00 = this->data_ + this->len;
  if (this->len != this->cap) {
    *__src_00 = *args;
    sVar1 = this->len;
    this->len = sVar1 + 1;
    return this->data_ + sVar1;
  }
  if (this->len != 0x7fffffffffffffff) {
    n = this->len + 1;
    uVar2 = this->cap;
    if (n < uVar2 * 2) {
      n = uVar2 * 2;
    }
    if (0x7fffffffffffffff - uVar2 < uVar2) {
      n = 0x7fffffffffffffff;
    }
    lVar3 = (long)__src_00 - (long)this->data_;
    __dest = (pointer)operator_new(n);
    __dest[lVar3] = *args;
    __src = this->data_;
    __n = this->len;
    if (__src + (__n - (long)__src_00) == (char *)0x0) {
      if (__n != 0) {
        memmove(__dest,__src,__n);
      }
    }
    else {
      if (__src != __src_00) {
        memmove(__dest,__src,(long)__src_00 - (long)__src);
      }
      memcpy(__dest + lVar3 + 1,__src_00,(size_t)(__src + (__n - (long)__src_00)));
    }
    if (__src != this->firstElement) {
      operator_delete(__src);
    }
    this->len = this->len + 1;
    this->cap = n;
    this->data_ = __dest;
    return __dest + lVar3;
  }
  detail::throwLengthError();
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }